

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestream.cc
# Opt level: O3

void __thiscall
google::protobuf::strings::GrowingArrayByteSink::ShrinkToFit(GrowingArrayByteSink *this)

{
  char *__src;
  char *__dest;
  ulong __n;
  
  if ((0x100 < this->capacity_) && (__n = this->size_, __n < this->capacity_ * 3 >> 2)) {
    __dest = (char *)operator_new__(__n);
    __src = this->buf_;
    memcpy(__dest,__src,__n);
    if (__src != (char *)0x0) {
      operator_delete__(__src);
      __n = this->size_;
    }
    this->buf_ = __dest;
    this->capacity_ = __n;
  }
  return;
}

Assistant:

void GrowingArrayByteSink::ShrinkToFit() {
  // Shrink only if the buffer is large and size_ is less than 3/4
  // of capacity_.
  if (capacity_ > 256 && size_ < (3 * capacity_) / 4) {
    char* just_enough = new char[size_];
    memcpy(just_enough, buf_, size_);
    delete[] buf_;
    buf_ = just_enough;
    capacity_ = size_;
  }
}